

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O1

DdNode * Cudd_bddAndLimit(DdManager *dd,DdNode *f,DdNode *g,uint limit)

{
  uint uVar1;
  DdNode *pDVar2;
  
  uVar1 = dd->maxLive;
  dd->maxLive = (limit + dd->keys + dd->keysZ) - (dd->dead + dd->deadZ);
  do {
    dd->reordered = 0;
    pDVar2 = cuddBddAndRecur(dd,f,g);
  } while (dd->reordered == 1);
  dd->maxLive = uVar1;
  return pDVar2;
}

Assistant:

DdNode *
Cudd_bddAndLimit(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  unsigned int limit)
{
    DdNode *res;
    unsigned int saveLimit = dd->maxLive;

    dd->maxLive = (dd->keys - dd->dead) + (dd->keysZ - dd->deadZ) + limit;
    do {
        dd->reordered = 0;
        res = cuddBddAndRecur(dd,f,g);
    } while (dd->reordered == 1);
    dd->maxLive = saveLimit;
    return(res);

}